

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O0

void __thiscall
amrex::MLNodeLinOp::applyBC
          (MLNodeLinOp *this,int amrlev,int mglev,MultiFab *phi,BCMode param_5,StateMode state_mode,
          bool skip_fillboundary)

{
  uint uVar1;
  undefined8 uVar2;
  bool bVar3;
  MLLinOp *in_RCX;
  Periodicity *in_RDI;
  int in_R9D;
  Periodicity PVar4;
  GpuArray<amrex::LinOpBCType,_3U> GVar5;
  byte in_stack_00000008;
  Array4<double> *fab;
  MFIter mfi;
  GpuArray<amrex::LinOpBCType,_3U> hibc;
  GpuArray<amrex::LinOpBCType,_3U> lobc;
  Box bx;
  Box *nd_domain;
  Geometry *geom;
  int i;
  size_type in_stack_fffffffffffffdd8;
  LinOpBCType in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  undefined4 in_stack_fffffffffffffde8;
  int icomp;
  MLLinOp *in_stack_fffffffffffffdf0;
  FabArray<amrex::FArrayBox> *this_00;
  uchar flags_;
  FabArrayBase *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  Box *in_stack_fffffffffffffe38;
  Array4<double> *in_stack_fffffffffffffe40;
  Box *in_stack_fffffffffffffe48;
  GpuArray<amrex::LinOpBCType,_3U> in_stack_fffffffffffffe60;
  MFIter local_168;
  LinOpBCType local_108 [3];
  undefined8 local_f4;
  LinOpBCType local_ec;
  LinOpBCType local_e8 [3];
  undefined8 local_d8;
  LinOpBCType LVar6;
  undefined4 in_stack_ffffffffffffff34;
  LinOpBCType in_stack_ffffffffffffff38;
  _func_int **local_ac;
  undefined8 local_a4;
  undefined8 local_9c;
  undefined4 local_94;
  undefined8 local_90;
  undefined8 local_88;
  undefined1 local_79;
  undefined8 local_70;
  Box *local_58;
  int local_4c;
  FabArray<amrex::FArrayBox> *local_48;
  int local_3c;
  undefined1 *local_38;
  undefined4 local_30;
  int local_2c;
  undefined1 *local_28;
  undefined1 *local_20;
  int local_14;
  undefined1 *local_10;
  int local_4;
  
  local_79 = in_stack_00000008 & 1;
  *(bool *)(in_RDI[0x73].period.vect + 2) = in_R9D == 0;
  local_70 = in_RCX;
  Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
               in_stack_fffffffffffffdd8);
  local_88 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                       ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                        CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                        in_stack_fffffffffffffdd8);
  local_58 = Geometry::Domain((Geometry *)local_88);
  local_ac = *(_func_int ***)(local_58->smallend).vect;
  local_a4 = *(undefined8 *)((local_58->smallend).vect + 2);
  uVar2 = *(undefined8 *)((local_58->bigend).vect + 1);
  uVar1 = (local_58->btype).itype;
  this_00 = (FabArray<amrex::FArrayBox> *)&stack0xffffffffffffff54;
  for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
    local_38 = (undefined1 *)&stack0xffffffffffffff6c;
    local_3c = local_4c;
    local_14 = local_4c;
    local_4 = local_4c;
    if ((uVar1 & 1 << ((byte)local_4c & 0x1f)) == 0) {
      local_28 = (undefined1 *)((long)register0x00000020 + -0xa0);
      local_2c = local_4c;
      local_30 = 1;
      *(int *)(local_28 + (long)local_4c * 4) = *(int *)(local_28 + (long)local_4c * 4) + 1;
    }
    local_10 = local_38;
  }
  local_20 = (undefined1 *)&stack0xffffffffffffff6c;
  local_94 = 7;
  local_90 = &stack0xffffffffffffff54;
  local_9c = uVar2;
  local_48 = this_00;
  if ((local_79 & 1) == 0) {
    PVar4 = Geometry::periodicity
                      ((Geometry *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    in_stack_ffffffffffffff38 = PVar4.period.vect[0];
    FabArray<amrex::FArrayBox>::FillBoundary<double>
              (this_00,in_RDI,SUB81((ulong)local_70 >> 0x38,0));
    in_stack_fffffffffffffdf0 = (MLLinOp *)local_70;
  }
  flags_ = (uchar)((ulong)this_00 >> 0x38);
  if (in_RDI[0x72].period.vect[2] == 0) {
    icomp = 0;
    GVar5 = MLLinOp::LoBC(in_stack_fffffffffffffdf0,0);
    local_e8[2] = GVar5.arr[2];
    local_e8._0_8_ = GVar5.arr._0_8_;
    local_d8._0_4_ = local_e8[0];
    local_d8._4_4_ = local_e8[1];
    LVar6 = local_e8[2];
    local_e8 = GVar5.arr;
    GVar5 = MLLinOp::HiBC(in_stack_fffffffffffffdf0,icomp);
    local_108._0_8_ = GVar5.arr._0_8_;
    local_f4._0_4_ = local_108[0];
    local_f4._4_4_ = local_108[1];
    local_108[2] = GVar5.arr[2];
    local_ec = local_108[2];
    local_108 = GVar5.arr;
    MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                   in_stack_fffffffffffffe08,flags_);
    while( true ) {
      bVar3 = MFIter::isValid(&local_168);
      if (!bVar3) break;
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)CONCAT44(icomp,in_stack_fffffffffffffde8),
                 (MFIter *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
      MFIter::validbox((MFIter *)in_stack_fffffffffffffdf0);
      GVar5.arr[1] = in_stack_ffffffffffffff34;
      GVar5.arr[0] = LVar6;
      GVar5.arr[2] = in_stack_ffffffffffffff38;
      in_stack_fffffffffffffde0 = local_ec;
      mlndlap_applybc<double>
                (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                 in_stack_fffffffffffffe60,GVar5);
      MFIter::operator++(&local_168);
    }
    MFIter::~MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  }
  return;
}

Assistant:

void
MLNodeLinOp::applyBC (int amrlev, int mglev, MultiFab& phi, BCMode/* bc_mode*/,
                      StateMode state_mode, bool skip_fillboundary) const
{
    BL_PROFILE("MLNodeLinOp::applyBC()");

    m_in_solution_mode = state_mode == StateMode::Solution;

    const Geometry& geom = m_geom[amrlev][mglev];
    const Box& nd_domain = amrex::surroundingNodes(geom.Domain());

    if (!skip_fillboundary) {
        phi.FillBoundary(geom.periodicity());
    }

    if (m_coarsening_strategy == CoarseningStrategy::Sigma)
    {
        const auto lobc = LoBC();
        const auto hibc = HiBC();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(phi); mfi.isValid(); ++mfi)
        {
            Array4<Real> const& fab = phi.array(mfi);
            mlndlap_applybc(mfi.validbox(),fab,nd_domain,lobc,hibc);
        }
    }
}